

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_watch_invalid_path(void)

{
  int iVar1;
  uv_fs_event_t *puVar2;
  undefined8 uVar3;
  
  puVar2 = (uv_fs_event_t *)uv_default_loop();
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    puVar2 = &fs_event;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar1 == 0) goto LAB_00151c2a;
    puVar2 = &fs_event;
    iVar1 = uv_is_active(&fs_event);
    if (iVar1 != 0) goto LAB_00151c2f;
    puVar2 = &fs_event;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar1 == 0) goto LAB_00151c34;
    puVar2 = &fs_event;
    iVar1 = uv_is_active(&fs_event);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar2 = (uv_fs_event_t *)uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00151c3e;
    }
  }
  else {
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00151c2a:
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00151c2f:
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00151c34:
    run_test_fs_event_watch_invalid_path_cold_5();
  }
  run_test_fs_event_watch_invalid_path_cold_3();
LAB_00151c3e:
  run_test_fs_event_watch_invalid_path_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(fs_event_watch_invalid_path) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "<:;", 0);
  ASSERT(r != 0);
  ASSERT(uv_is_active((uv_handle_t*) &fs_event) == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "", 0);
  ASSERT(r != 0);
  ASSERT(uv_is_active((uv_handle_t*) &fs_event) == 0);
  MAKE_VALGRIND_HAPPY();
  return 0;
}